

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall
ImGuiTextFilter::TextRange::split
          (TextRange *this,char separator,ImVector<ImGuiTextFilter::TextRange> *out)

{
  int *piVar1;
  int iVar2;
  TextRange *pTVar3;
  ImGuiContext *pIVar4;
  char *pcVar5;
  int iVar6;
  TextRange *pTVar7;
  char *pcVar8;
  char *pcVar9;
  int iVar10;
  
  pIVar4 = GImGui;
  iVar10 = out->Capacity;
  if (iVar10 < 0) {
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    pTVar3 = (TextRange *)(*(pIVar4->IO).MemAllocFn)(0);
    if (out->Data == (TextRange *)0x0) {
LAB_001204a4:
      pTVar7 = (TextRange *)0x0;
      pIVar4 = GImGui;
    }
    else {
      memcpy(pTVar3,out->Data,(long)out->Size << 4);
      pIVar4 = GImGui;
      pTVar7 = out->Data;
      if (pTVar7 == (TextRange *)0x0) goto LAB_001204a4;
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
    }
    (*(pIVar4->IO).MemFreeFn)(pTVar7);
    out->Data = pTVar3;
    out->Capacity = 0;
    iVar10 = 0;
  }
  out->Size = 0;
  pcVar8 = this->b;
  pcVar5 = this->e;
  if (pcVar5 <= pcVar8) {
    return;
  }
  iVar2 = 0;
  pcVar9 = pcVar8;
  do {
    pIVar4 = GImGui;
    if (*pcVar8 == separator) {
      if (iVar2 == iVar10) {
        if (iVar10 == 0) {
          iVar2 = 8;
        }
        else {
          iVar2 = iVar10 / 2 + iVar10;
        }
        iVar10 = iVar10 + 1;
        if (iVar10 < iVar2) {
          iVar10 = iVar2;
        }
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + 1;
        pTVar3 = (TextRange *)(*(pIVar4->IO).MemAllocFn)((long)iVar10 << 4);
        if (out->Data == (TextRange *)0x0) {
LAB_00120566:
          pTVar7 = (TextRange *)0x0;
          pIVar4 = GImGui;
        }
        else {
          memcpy(pTVar3,out->Data,(long)out->Size << 4);
          pIVar4 = GImGui;
          pTVar7 = out->Data;
          if (pTVar7 == (TextRange *)0x0) goto LAB_00120566;
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + -1;
        }
        (*(pIVar4->IO).MemFreeFn)(pTVar7);
        out->Data = pTVar3;
        out->Capacity = iVar10;
        iVar2 = out->Size;
      }
      else {
        pTVar3 = out->Data;
      }
      out->Size = iVar2 + 1;
      pTVar3[iVar2].b = pcVar9;
      pTVar3[iVar2].e = pcVar8;
      pcVar9 = pcVar8 + 1;
      pcVar5 = this->e;
      iVar2 = iVar2 + 1;
    }
    pIVar4 = GImGui;
    pcVar8 = pcVar8 + 1;
  } while (pcVar8 < pcVar5);
  if (pcVar8 == pcVar9) {
    return;
  }
  if (iVar2 != iVar10) {
    pTVar3 = out->Data;
    goto LAB_00120641;
  }
  if (iVar10 == 0) {
    iVar2 = 8;
  }
  else {
    iVar2 = iVar10 / 2 + iVar10;
  }
  iVar6 = iVar10 + 1;
  if (iVar10 + 1 < iVar2) {
    iVar6 = iVar2;
  }
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  pTVar3 = (TextRange *)(*(pIVar4->IO).MemAllocFn)((long)iVar6 << 4);
  if (out->Data == (TextRange *)0x0) {
LAB_00120630:
    pTVar7 = (TextRange *)0x0;
    pIVar4 = GImGui;
  }
  else {
    memcpy(pTVar3,out->Data,(long)out->Size << 4);
    pIVar4 = GImGui;
    pTVar7 = out->Data;
    if (pTVar7 == (TextRange *)0x0) goto LAB_00120630;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
  }
  (*(pIVar4->IO).MemFreeFn)(pTVar7);
  out->Data = pTVar3;
  out->Capacity = iVar6;
  iVar2 = out->Size;
LAB_00120641:
  out->Size = iVar2 + 1;
  pTVar3[iVar2].b = pcVar9;
  pTVar3[iVar2].e = pcVar8;
  return;
}

Assistant:

void ImGuiTextFilter::TextRange::split(char separator, ImVector<TextRange>& out)
{
    out.resize(0);
    const char* wb = b;
    const char* we = wb;
    while (we < e)
    {
        if (*we == separator)
        {
            out.push_back(TextRange(wb, we));
            wb = we + 1;
        }
        we++;
    }
    if (wb != we)
        out.push_back(TextRange(wb, we));
}